

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
::Inner::Inner(Inner *this,Params *p)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = p->bucket_cnt;
  (this->set_).ctrl_ =
       EmptyGroup<std::is_same<std::allocator<phmap::priv::(anonymous_namespace)::Entry>,std::allocator<phmap::priv::(anonymous_namespace)::Entry>>>()
       ::empty_group;
  (this->set_).settings_.
  super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  (this->set_).capacity_ = 0;
  (this->set_).slots_ = (slot_type *)0x0;
  (this->set_).size_ = 0;
  if (uVar2 != 0) {
    lVar1 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar2 = 0xffffffffffffffff >> (~(byte)lVar1 & 0x3f);
    raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
    ::reset_growth_left(&this->set_,uVar2);
    raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::(anonymous_namespace)::Entry>,_phmap::Hash<phmap::priv::(anonymous_namespace)::Entry>,_phmap::EqualTo<phmap::priv::(anonymous_namespace)::Entry>,_std::allocator<phmap::priv::(anonymous_namespace)::Entry>_>
    ::initialize_slots(&this->set_,uVar2);
    (this->set_).capacity_ = uVar2;
  }
  return;
}

Assistant:

Inner(Params const &p) : set_(p.bucket_cnt, p.hashfn, p.eq, p.alloc)
        {}